

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.h
# Opt level: O3

void __thiscall Polynom<Finite>::Polynom(Polynom<Finite> *this,Matrix<Finite> *matr)

{
  runtime_error *this_00;
  
  Matrix<Finite>::Matrix(&this->m,matr);
  if (matr->M == 1) {
    strip(this);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Polynom: matrix 1*n required");
  *(undefined ***)this_00 = &PTR__runtime_error_0015ed00;
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit Polynom(const Matrix<Field> &matr): m(matr)
    {
        if(matr.height() != 1)
            throw matrix_error("Polynom: matrix 1*n required");
        strip();
    }